

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void __thiscall pybind11::arg_v::arg_v<double>(arg_v *this,arg *base,double *x,char *descr)

{
  undefined8 uVar1;
  PyObject *pPVar2;
  size_t sVar3;
  char *__s;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  pPVar2 = (PyObject *)PyFloat_FromDouble(SUB84(*x,0));
  (this->value).super_handle.m_ptr = pPVar2;
  this->descr = descr;
  __s = _PyUnicode_AsUTF8String + (*_PyUnicode_AsUTF8String == '*');
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->type,__s,__s + sVar3);
  detail::clean_type_id(&this->type);
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }